

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O1

string * __thiscall
cmWatchpoint::GetTypeAsString_abi_cxx11_
          (string *__return_storage_ptr__,cmWatchpoint *this,WatchpointType type)

{
  long *plVar1;
  long *plVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  long *local_70;
  long local_60;
  long lStack_58;
  string local_50;
  
  paVar3 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar3;
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar5 = "NONE";
    pcVar4 = "";
    break;
  case 1:
    pcVar5 = "DEFINE";
    pcVar4 = "";
    break;
  case 2:
    pcVar5 = "WRITE";
    pcVar4 = "";
    break;
  default:
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    lVar6 = 0;
    do {
      if ((*(uint *)((long)&DAT_005d7508 + lVar6) & (uint)this) != 0) {
        GetTypeAsString_abi_cxx11_
                  (&local_50,(cmWatchpoint *)(ulong)*(uint *)((long)&DAT_005d7508 + lVar6),
                   (WatchpointType)paVar3);
        plVar1 = (long *)std::__cxx11::string::append((char *)&local_50);
        plVar2 = plVar1 + 2;
        if ((long *)*plVar1 == plVar2) {
          local_60 = *plVar2;
          lStack_58 = plVar1[3];
          local_70 = &local_60;
        }
        else {
          local_60 = *plVar2;
          local_70 = (long *)*plVar1;
        }
        *plVar1 = (long)plVar2;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_70);
        paVar3 = extraout_RDX;
        if (local_70 != &local_60) {
          operator_delete(local_70,local_60 + 1);
          paVar3 = extraout_RDX_00;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          paVar3 = extraout_RDX_01;
        }
      }
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x18);
    if (__return_storage_ptr__->_M_string_length != 0) {
      std::__cxx11::string::pop_back();
      std::__cxx11::string::pop_back();
      return __return_storage_ptr__;
    }
    __assert_fail("!rtn.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmDebugger.cxx"
                  ,0x23d,
                  "static std::string cmWatchpoint::GetTypeAsString(cmWatchpoint::WatchpointType)");
  case 4:
    pcVar5 = "READ";
    pcVar4 = "";
    break;
  case 8:
    pcVar5 = "UNDEFINED";
    pcVar4 = "";
    break;
  case 0xb:
    pcVar5 = "MODIFY";
    pcVar4 = "";
    break;
  case 0xf:
    pcVar5 = "ALL";
    pcVar4 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar5,pcVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string cmWatchpoint::GetTypeAsString(cmWatchpoint::WatchpointType type)
{
  switch (type) {
    case WATCHPOINT_NONE:
      return "NONE";
    case WATCHPOINT_ALL:
      return "ALL";
    case WATCHPOINT_MODIFY:
      return "MODIFY";
    case WATCHPOINT_DEFINE:
      return "DEFINE";
    case WATCHPOINT_READ:
      return "READ";
    case WATCHPOINT_UNDEFINED:
      return "UNDEFINED";
    case WATCHPOINT_WRITE:
      return "WRITE";
    default:
      break;
  }

  std::string rtn;
  for (auto field : { WATCHPOINT_WRITE, WATCHPOINT_UNDEFINED, WATCHPOINT_READ,
                      WATCHPOINT_DEFINE, WATCHPOINT_MODIFY, WATCHPOINT_ALL }) {
    if (field & type) {
      rtn += GetTypeAsString(field) + ", ";
    }
  }

  // If it doesn't match any of the bits in the field or none, what exactly was
  // passed in?
  assert(!rtn.empty());

  // Remove last comma and space
  if (!rtn.empty()) {
    rtn.pop_back();
    rtn.pop_back();
  }

  return rtn;
}